

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execCmpiEa<(moira::Instr)39,(moira::Mode)7,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  byte bVar5;
  
  bVar5 = (byte)(this->queue).irc;
  readExt(this);
  uVar2 = computeEA<(moira::Mode)7,(moira::Size)1,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,uVar2);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  iVar4 = uVar3 - bVar5;
  (this->reg).sr.c = (bool)((byte)((uint)iVar4 >> 8) & 1);
  bVar1 = (byte)iVar4;
  (this->reg).sr.v = (bool)((byte)(((byte)uVar3 ^ bVar1) & (bVar5 ^ (byte)uVar3)) >> 7);
  (this->reg).sr.z = bVar1 == 0;
  (this->reg).sr.n = (bool)(bVar1 >> 7);
  return;
}

Assistant:

void
Moira::execCmpiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    prefetch();

    cmp<S>(src, data);
}